

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexParser.cpp
# Opt level: O0

AltNode * __thiscall
UnifiedRegex::Parser<NullTerminatedUnicodeEncodingPolicy,_true>::AppendSurrogateRangeToDisjunction
          (Parser<NullTerminatedUnicodeEncodingPolicy,_true> *this,codepoint_t minorCodePoint,
          codepoint_t majorCodePoint,AltNode *lastAltNode)

{
  code *pcVar1;
  Node *head;
  bool bVar2;
  undefined4 *puVar3;
  ScriptConfiguration *this_00;
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *pAVar4;
  MatchCharNode *pMVar5;
  MatchSetNode *pMVar6;
  ConcatNode *pCVar7;
  ConcatNode *pCVar8;
  AltNode *pAVar9;
  AltNode *this_01;
  bool local_7d9;
  TrackAllocData local_5b0;
  code *local_588;
  undefined8 local_580;
  TrackAllocData local_578;
  code *local_550;
  undefined8 local_548;
  TrackAllocData local_540;
  code *local_518;
  undefined8 local_510;
  TrackAllocData local_508;
  code *local_4e0;
  undefined8 local_4d8;
  TrackAllocData local_4d0;
  code *local_4a8;
  undefined8 local_4a0;
  TrackAllocData local_498;
  MatchSetNode *local_470;
  MatchSetNode *fullUpperRange;
  undefined8 local_460;
  TrackAllocData local_458;
  MatchSetNode *local_430;
  MatchSetNode *setNode_1;
  undefined8 local_420;
  TrackAllocData local_418;
  undefined1 local_3ef;
  char16 local_3ee;
  Char local_3ec;
  Char local_3ea;
  bool singleFullRange;
  char16 ignore;
  char16 lowerMajorBoundary;
  MatchSetNode *pMStack_3e8;
  char16 lowerMinorBoundary;
  Node *lowerOfFullRange;
  undefined8 local_3d8;
  TrackAllocData local_3d0;
  code *local_3a8;
  undefined8 local_3a0;
  TrackAllocData local_398;
  bool local_369;
  code *pcStack_368;
  bool nonFullConsecutiveRanges;
  undefined8 local_360;
  TrackAllocData local_358;
  code *local_330;
  undefined8 local_328;
  TrackAllocData local_320;
  code *local_2f8;
  undefined8 local_2f0;
  TrackAllocData local_2e8;
  MatchSetNode *local_2c0;
  MatchSetNode *upperSetNode_1;
  undefined8 local_2b0;
  TrackAllocData local_2a8;
  MatchCharNode *local_280;
  MatchCharNode *lowerCharNode_2;
  undefined8 local_270;
  TrackAllocData local_268;
  code *local_240;
  undefined8 local_238;
  TrackAllocData local_230;
  code *local_208;
  undefined8 local_200;
  TrackAllocData local_1f8;
  MatchSetNode *local_1d0;
  MatchSetNode *upperSetNode;
  undefined8 local_1c0;
  TrackAllocData local_1b8;
  MatchCharNode *local_190;
  MatchCharNode *lowerCharNode_1;
  ConcatNode *pCStack_180;
  bool twoConsecutiveRanges;
  Node *suffixNode;
  Node *prefixNode;
  undefined8 local_168;
  TrackAllocData local_160;
  code *local_138;
  undefined8 local_130;
  TrackAllocData local_128;
  code *local_100;
  undefined8 local_f8;
  TrackAllocData local_f0;
  ConcatNode *local_c8;
  ConcatNode *concatNode;
  undefined8 local_b8;
  TrackAllocData local_b0;
  MatchSetNode *local_88;
  MatchSetNode *setNode;
  undefined8 local_78;
  TrackAllocData local_70;
  MatchCharNode *local_48;
  MatchCharNode *lowerCharNode;
  AltNode *pAStack_38;
  bool singleRange;
  AltNode *tailToAdd;
  codepoint_t majorBoundary;
  codepoint_t minorBoundary;
  char16 upperMajorCodeUnit;
  char16 lowerMajorCodeUnit;
  char16 upperMinorCodeUnit;
  char16 lowerMinorCodeUnit;
  AltNode *lastAltNode_local;
  codepoint_t majorCodePoint_local;
  codepoint_t minorCodePoint_local;
  Parser<NullTerminatedUnicodeEncodingPolicy,_true> *this_local;
  
  _upperMajorCodeUnit = lastAltNode;
  lastAltNode_local._0_4_ = majorCodePoint;
  lastAltNode_local._4_4_ = minorCodePoint;
  _majorCodePoint_local = this;
  if (majorCodePoint <= minorCodePoint) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                       ,0x194,"(minorCodePoint < majorCodePoint)","minorCodePoint < majorCodePoint")
    ;
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  if (lastAltNode_local._4_4_ < 0x10000) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                       ,0x195,"(minorCodePoint >= 0x10000u)","minorCodePoint >= 0x10000u");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  if ((codepoint_t)lastAltNode_local < 0x10000) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                       ,0x196,"(majorCodePoint >= 0x10000u)","majorCodePoint >= 0x10000u");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  this_00 = Js::ScriptContext::GetConfig(this->scriptContext);
  bVar2 = Js::ScriptConfiguration::IsES6UnicodeExtensionsEnabled(this_00);
  if ((!bVar2) || ((this->unicodeFlagPresent & 1U) == 0)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                       ,0x197,
                       "(scriptContext->GetConfig()->IsES6UnicodeExtensionsEnabled() && unicodeFlagPresent)"
                       ,
                       "scriptContext->GetConfig()->IsES6UnicodeExtensionsEnabled() && unicodeFlagPresent"
                      );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  Js::NumberUtilities::CodePointAsSurrogatePair
            (lastAltNode_local._4_4_,(char16 *)((long)&minorBoundary + 2),(char16 *)&minorBoundary);
  Js::NumberUtilities::CodePointAsSurrogatePair
            ((codepoint_t)lastAltNode_local,(char16 *)((long)&majorBoundary + 2),
             (char16 *)&majorBoundary);
  tailToAdd._4_4_ = (lastAltNode_local._4_4_ - (lastAltNode_local._4_4_ & 0x3ff)) + 0x400;
  tailToAdd._0_4_ = (codepoint_t)lastAltNode_local - ((codepoint_t)lastAltNode_local & 0x3ff);
  if (tailToAdd._4_4_ < 0x10000) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                       ,0x1a3,"(minorBoundary >= 0x10000)","minorBoundary >= 0x10000");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  if ((uint)tailToAdd < 0x10000) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                       ,0x1a4,"(majorBoundary >= 0x10000)","majorBoundary >= 0x10000");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  pAStack_38 = (AltNode *)0x0;
  lowerCharNode._7_1_ = (uint)tailToAdd < tailToAdd._4_4_;
  if ((bool)lowerCharNode._7_1_) {
    if (0x3ff < (codepoint_t)lastAltNode_local - lastAltNode_local._4_4_) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                         ,0x1ae,"(majorCodePoint - minorCodePoint < 0x400u)",
                         "majorCodePoint - minorCodePoint < 0x400u");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 0;
    }
    if (minorBoundary._2_2_ != majorBoundary._2_2_) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                         ,0x1af,"(lowerMinorCodeUnit == lowerMajorCodeUnit)",
                         "lowerMinorCodeUnit == lowerMajorCodeUnit");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 0;
    }
    pAVar4 = &this->ctAllocator->
              super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_70,(type_info *)&MatchCharNode::typeinfo,0,0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
               ,0x1b1);
    pAVar4 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
             TrackAllocInfo(pAVar4,&local_70);
    setNode = (MatchSetNode *)Memory::ArenaAllocator::Alloc;
    local_78 = 0;
    pMVar5 = (MatchCharNode *)new<Memory::ArenaAllocator>(0x48,(ArenaAllocator *)pAVar4,0x3f67b0);
    MatchCharNode::MatchCharNode(pMVar5,minorBoundary._2_2_);
    pAVar4 = &this->ctAllocator->
              super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
    local_48 = pMVar5;
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_b0,(type_info *)&MatchSetNode::typeinfo,0,0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
               ,0x1b2);
    pAVar4 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
             TrackAllocInfo(pAVar4,&local_b0);
    concatNode = (ConcatNode *)Memory::ArenaAllocator::Alloc;
    local_b8 = 0;
    pMVar6 = (MatchSetNode *)new<Memory::ArenaAllocator>(0x68,(ArenaAllocator *)pAVar4,0x3f67b0);
    MatchSetNode::MatchSetNode(pMVar6,false,false);
    local_88 = pMVar6;
    CharSet<char16_t>::SetRange
              (&pMVar6->set,this->ctAllocator,(char16)minorBoundary,(Char)majorBoundary);
    pAVar4 = &this->ctAllocator->
              super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_f0,(type_info *)&ConcatNode::typeinfo,0,0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
               ,0x1b4);
    pAVar4 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
             TrackAllocInfo(pAVar4,&local_f0);
    local_100 = Memory::ArenaAllocator::Alloc;
    local_f8 = 0;
    pCVar7 = (ConcatNode *)new<Memory::ArenaAllocator>(0x48,(ArenaAllocator *)pAVar4,0x3f67b0);
    pMVar5 = local_48;
    pAVar4 = &this->ctAllocator->
              super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_128,(type_info *)&ConcatNode::typeinfo,0,0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
               ,0x1b4);
    pAVar4 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
             TrackAllocInfo(pAVar4,&local_128);
    local_138 = Memory::ArenaAllocator::Alloc;
    local_130 = 0;
    pCVar8 = (ConcatNode *)new<Memory::ArenaAllocator>(0x48,(ArenaAllocator *)pAVar4,0x3f67b0);
    ConcatNode::ConcatNode(pCVar8,&local_88->super_Node,(ConcatNode *)0x0);
    ConcatNode::ConcatNode(pCVar7,&pMVar5->super_Node,pCVar8);
    pAVar4 = &this->ctAllocator->
              super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
    local_c8 = pCVar7;
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_160,(type_info *)&AltNode::typeinfo,0,0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
               ,0x1b6);
    pAVar4 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
             TrackAllocInfo(pAVar4,&local_160);
    prefixNode = (Node *)Memory::ArenaAllocator::Alloc;
    local_168 = 0;
    pAVar9 = (AltNode *)new<Memory::ArenaAllocator>(0x60,(ArenaAllocator *)pAVar4,0x3f67b0);
    AltNode::AltNode(pAVar9,&local_c8->super_Node,(AltNode *)0x0);
    pAStack_38 = pAVar9;
  }
  else {
    suffixNode = (Node *)0x0;
    pCStack_180 = (ConcatNode *)0x0;
    lowerCharNode_1._7_1_ = tailToAdd._4_4_ == (uint)tailToAdd;
    if (tailToAdd._4_4_ - lastAltNode_local._4_4_ == 1) {
      suffixNode = CreateSurrogatePairAtom(this,minorBoundary._2_2_,(char16)minorBoundary);
    }
    else if (lastAltNode_local._4_4_ == tailToAdd._4_4_ - 0x400) {
      tailToAdd._4_4_ = tailToAdd._4_4_ - 0x400;
    }
    else {
      if (0x3ff < tailToAdd._4_4_ - lastAltNode_local._4_4_) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar3 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                           ,0x1c5,"(minorBoundary - minorCodePoint < 0x400u)",
                           "minorBoundary - minorCodePoint < 0x400u");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar3 = 0;
      }
      pAVar4 = &this->ctAllocator->
                super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
      Memory::TrackAllocData::CreateTrackAllocData
                (&local_1b8,(type_info *)&MatchCharNode::typeinfo,0,0xffffffffffffffff,
                 "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                 ,0x1c6);
      pAVar4 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
               TrackAllocInfo(pAVar4,&local_1b8);
      upperSetNode = (MatchSetNode *)Memory::ArenaAllocator::Alloc;
      local_1c0 = 0;
      pMVar5 = (MatchCharNode *)new<Memory::ArenaAllocator>(0x48,(ArenaAllocator *)pAVar4,0x3f67b0);
      MatchCharNode::MatchCharNode(pMVar5,minorBoundary._2_2_);
      pAVar4 = &this->ctAllocator->
                super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
      local_190 = pMVar5;
      Memory::TrackAllocData::CreateTrackAllocData
                (&local_1f8,(type_info *)&MatchSetNode::typeinfo,0,0xffffffffffffffff,
                 "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                 ,0x1c7);
      pAVar4 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
               TrackAllocInfo(pAVar4,&local_1f8);
      local_208 = Memory::ArenaAllocator::Alloc;
      local_200 = 0;
      pMVar6 = (MatchSetNode *)new<Memory::ArenaAllocator>(0x68,(ArenaAllocator *)pAVar4,0x3f67b0);
      MatchSetNode::MatchSetNode(pMVar6,false,true);
      local_1d0 = pMVar6;
      CharSet<char16_t>::SetRange(&pMVar6->set,this->ctAllocator,(char16)minorBoundary,L'\xdfff');
      pAVar4 = &this->ctAllocator->
                super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
      Memory::TrackAllocData::CreateTrackAllocData
                (&local_230,(type_info *)&ConcatNode::typeinfo,0,0xffffffffffffffff,
                 "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                 ,0x1c9);
      pAVar4 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
               TrackAllocInfo(pAVar4,&local_230);
      local_240 = Memory::ArenaAllocator::Alloc;
      local_238 = 0;
      pCVar7 = (ConcatNode *)new<Memory::ArenaAllocator>(0x48,(ArenaAllocator *)pAVar4,0x3f67b0);
      pMVar5 = local_190;
      pAVar4 = &this->ctAllocator->
                super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
      Memory::TrackAllocData::CreateTrackAllocData
                (&local_268,(type_info *)&ConcatNode::typeinfo,0,0xffffffffffffffff,
                 "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                 ,0x1c9);
      pAVar4 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
               TrackAllocInfo(pAVar4,&local_268);
      lowerCharNode_2 = (MatchCharNode *)Memory::ArenaAllocator::Alloc;
      local_270 = 0;
      pCVar8 = (ConcatNode *)new<Memory::ArenaAllocator>(0x48,(ArenaAllocator *)pAVar4,0x3f67b0);
      ConcatNode::ConcatNode(pCVar8,&local_1d0->super_Node,(ConcatNode *)0x0);
      ConcatNode::ConcatNode(pCVar7,&pMVar5->super_Node,pCVar8);
      suffixNode = (Node *)pCVar7;
    }
    if ((uint)tailToAdd == (codepoint_t)lastAltNode_local) {
      pCStack_180 = (ConcatNode *)
                    CreateSurrogatePairAtom(this,majorBoundary._2_2_,(Char)majorBoundary);
      tailToAdd._0_4_ = (uint)tailToAdd - 0x400;
    }
    else if ((uint)tailToAdd + 0x3ff != (codepoint_t)lastAltNode_local) {
      if (0x3fe < (codepoint_t)lastAltNode_local - (uint)tailToAdd) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar3 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                           ,0x1d8,"(majorCodePoint - majorBoundary < 0x3FFu)",
                           "majorCodePoint - majorBoundary < 0x3FFu");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar3 = 0;
      }
      pAVar4 = &this->ctAllocator->
                super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
      Memory::TrackAllocData::CreateTrackAllocData
                (&local_2a8,(type_info *)&MatchCharNode::typeinfo,0,0xffffffffffffffff,
                 "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                 ,0x1d9);
      pAVar4 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
               TrackAllocInfo(pAVar4,&local_2a8);
      upperSetNode_1 = (MatchSetNode *)Memory::ArenaAllocator::Alloc;
      local_2b0 = 0;
      pMVar5 = (MatchCharNode *)new<Memory::ArenaAllocator>(0x48,(ArenaAllocator *)pAVar4,0x3f67b0);
      MatchCharNode::MatchCharNode(pMVar5,majorBoundary._2_2_);
      pAVar4 = &this->ctAllocator->
                super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
      local_280 = pMVar5;
      Memory::TrackAllocData::CreateTrackAllocData
                (&local_2e8,(type_info *)&MatchSetNode::typeinfo,0,0xffffffffffffffff,
                 "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                 ,0x1da);
      pAVar4 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
               TrackAllocInfo(pAVar4,&local_2e8);
      local_2f8 = Memory::ArenaAllocator::Alloc;
      local_2f0 = 0;
      pMVar6 = (MatchSetNode *)new<Memory::ArenaAllocator>(0x68,(ArenaAllocator *)pAVar4,0x3f67b0);
      MatchSetNode::MatchSetNode(pMVar6,false,false);
      local_2c0 = pMVar6;
      CharSet<char16_t>::SetRange(&pMVar6->set,this->ctAllocator,L'\xdc00',(Char)majorBoundary);
      pAVar4 = &this->ctAllocator->
                super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
      Memory::TrackAllocData::CreateTrackAllocData
                (&local_320,(type_info *)&ConcatNode::typeinfo,0,0xffffffffffffffff,
                 "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                 ,0x1dc);
      pAVar4 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
               TrackAllocInfo(pAVar4,&local_320);
      local_330 = Memory::ArenaAllocator::Alloc;
      local_328 = 0;
      pCVar7 = (ConcatNode *)new<Memory::ArenaAllocator>(0x48,(ArenaAllocator *)pAVar4,0x3f67b0);
      pMVar5 = local_280;
      pAVar4 = &this->ctAllocator->
                super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
      Memory::TrackAllocData::CreateTrackAllocData
                (&local_358,(type_info *)&ConcatNode::typeinfo,0,0xffffffffffffffff,
                 "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                 ,0x1dc);
      pAVar4 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
               TrackAllocInfo(pAVar4,&local_358);
      pcStack_368 = Memory::ArenaAllocator::Alloc;
      local_360 = 0;
      pCVar8 = (ConcatNode *)new<Memory::ArenaAllocator>(0x48,(ArenaAllocator *)pAVar4,0x3f67b0);
      ConcatNode::ConcatNode(pCVar8,&local_2c0->super_Node,(ConcatNode *)0x0);
      ConcatNode::ConcatNode(pCVar7,&pMVar5->super_Node,pCVar8);
      tailToAdd._0_4_ = (uint)tailToAdd - 0x400;
      pCStack_180 = pCVar7;
    }
    local_7d9 = false;
    if (((lowerCharNode_1._7_1_ & 1) != 0) && (local_7d9 = false, suffixNode != (Node *)0x0)) {
      local_7d9 = pCStack_180 != (ConcatNode *)0x0;
    }
    local_369 = local_7d9;
    if (local_7d9 == false) {
      if ((codepoint_t)lastAltNode_local - lastAltNode_local._4_4_ < 0x400) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar3 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                           ,0x1ef,"(majorCodePoint - minorCodePoint >= 0x400u)",
                           "majorCodePoint - minorCodePoint >= 0x400u");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar3 = 0;
      }
      if ((((suffixNode == (Node *)0x0) || (pCStack_180 == (ConcatNode *)0x0)) &&
          ((suffixNode != (Node *)0x0 || (tailToAdd._4_4_ != lastAltNode_local._4_4_)))) &&
         ((pCStack_180 != (ConcatNode *)0x0 ||
          ((uint)tailToAdd + 0x3ff != (codepoint_t)lastAltNode_local)))) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar3 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                           ,0x1f2,
                           "((prefixNode != nullptr && suffixNode != nullptr) || (prefixNode == nullptr && minorBoundary == minorCodePoint) || (suffixNode == nullptr && majorBoundary + 0x3FFu == majorCodePoint))"
                           ,
                           "(prefixNode != nullptr && suffixNode != nullptr) || (prefixNode == nullptr && minorBoundary == minorCodePoint) || (suffixNode == nullptr && majorBoundary + 0x3FFu == majorCodePoint)"
                          );
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar3 = 0;
      }
      Js::NumberUtilities::CodePointAsSurrogatePair(tailToAdd._4_4_,&local_3ea,&local_3ee);
      local_3ef = (uint)tailToAdd == tailToAdd._4_4_;
      if ((bool)local_3ef) {
        pAVar4 = &this->ctAllocator->
                  super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
        Memory::TrackAllocData::CreateTrackAllocData
                  (&local_418,(type_info *)&MatchCharNode::typeinfo,0,0xffffffffffffffff,
                   "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                   ,0x1fc);
        pAVar4 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
                 TrackAllocInfo(pAVar4,&local_418);
        setNode_1 = (MatchSetNode *)Memory::ArenaAllocator::Alloc;
        local_420 = 0;
        pMVar6 = (MatchSetNode *)new<Memory::ArenaAllocator>(0x48,(ArenaAllocator *)pAVar4,0x3f67b0)
        ;
        MatchCharNode::MatchCharNode((MatchCharNode *)pMVar6,local_3ea);
        pMStack_3e8 = pMVar6;
      }
      else {
        Js::NumberUtilities::CodePointAsSurrogatePair((uint)tailToAdd,&local_3ec,&local_3ee);
        pAVar4 = &this->ctAllocator->
                  super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
        Memory::TrackAllocData::CreateTrackAllocData
                  (&local_458,(type_info *)&MatchSetNode::typeinfo,0,0xffffffffffffffff,
                   "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                   ,0x202);
        pAVar4 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
                 TrackAllocInfo(pAVar4,&local_458);
        fullUpperRange = (MatchSetNode *)Memory::ArenaAllocator::Alloc;
        local_460 = 0;
        pMVar6 = (MatchSetNode *)new<Memory::ArenaAllocator>(0x68,(ArenaAllocator *)pAVar4,0x3f67b0)
        ;
        MatchSetNode::MatchSetNode(pMVar6,false,false);
        local_430 = pMVar6;
        CharSet<char16_t>::SetRange(&pMVar6->set,this->ctAllocator,local_3ea,local_3ec);
        pMStack_3e8 = local_430;
      }
      pAVar4 = &this->ctAllocator->
                super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
      Memory::TrackAllocData::CreateTrackAllocData
                (&local_498,(type_info *)&MatchSetNode::typeinfo,0,0xffffffffffffffff,
                 "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                 ,0x206);
      pAVar4 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
               TrackAllocInfo(pAVar4,&local_498);
      local_4a8 = Memory::ArenaAllocator::Alloc;
      local_4a0 = 0;
      pMVar6 = (MatchSetNode *)new<Memory::ArenaAllocator>(0x68,(ArenaAllocator *)pAVar4,0x3f67b0);
      MatchSetNode::MatchSetNode(pMVar6,false,false);
      local_470 = pMVar6;
      CharSet<char16_t>::SetRange(&pMVar6->set,this->ctAllocator,L'\xdc00',L'\xdfff');
      if (pCStack_180 != (ConcatNode *)0x0) {
        pAVar4 = &this->ctAllocator->
                  super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
        Memory::TrackAllocData::CreateTrackAllocData
                  (&local_4d0,(type_info *)&AltNode::typeinfo,0,0xffffffffffffffff,
                   "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                   ,0x20d);
        pAVar4 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
                 TrackAllocInfo(pAVar4,&local_4d0);
        local_4e0 = Memory::ArenaAllocator::Alloc;
        local_4d8 = 0;
        pAVar9 = (AltNode *)new<Memory::ArenaAllocator>(0x60,(ArenaAllocator *)pAVar4,0x3f67b0);
        AltNode::AltNode(pAVar9,&pCStack_180->super_Node,pAStack_38);
        pAStack_38 = pAVar9;
      }
      if (suffixNode != (Node *)0x0) {
        pAVar4 = &this->ctAllocator->
                  super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
        Memory::TrackAllocData::CreateTrackAllocData
                  (&local_508,(type_info *)&AltNode::typeinfo,0,0xffffffffffffffff,
                   "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                   ,0x211);
        pAVar4 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
                 TrackAllocInfo(pAVar4,&local_508);
        local_518 = Memory::ArenaAllocator::Alloc;
        local_510 = 0;
        pAVar9 = (AltNode *)new<Memory::ArenaAllocator>(0x60,(ArenaAllocator *)pAVar4,0x3f67b0);
        AltNode::AltNode(pAVar9,suffixNode,pAStack_38);
        pAStack_38 = pAVar9;
      }
      pAVar4 = &this->ctAllocator->
                super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
      Memory::TrackAllocData::CreateTrackAllocData
                (&local_540,(type_info *)&AltNode::typeinfo,0,0xffffffffffffffff,
                 "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                 ,0x213);
      pAVar4 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
               TrackAllocInfo(pAVar4,&local_540);
      local_550 = Memory::ArenaAllocator::Alloc;
      local_548 = 0;
      pAVar9 = (AltNode *)new<Memory::ArenaAllocator>(0x60,(ArenaAllocator *)pAVar4,0x3f67b0);
      pAVar4 = &this->ctAllocator->
                super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
      Memory::TrackAllocData::CreateTrackAllocData
                (&local_578,(type_info *)&ConcatNode::typeinfo,0,0xffffffffffffffff,
                 "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                 ,0x213);
      pAVar4 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
               TrackAllocInfo(pAVar4,&local_578);
      local_588 = Memory::ArenaAllocator::Alloc;
      local_580 = 0;
      pCVar7 = (ConcatNode *)new<Memory::ArenaAllocator>(0x48,(ArenaAllocator *)pAVar4,0x3f67b0);
      pMVar6 = pMStack_3e8;
      pAVar4 = &this->ctAllocator->
                super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
      Memory::TrackAllocData::CreateTrackAllocData
                (&local_5b0,(type_info *)&ConcatNode::typeinfo,0,0xffffffffffffffff,
                 "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                 ,0x213);
      pAVar4 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
               TrackAllocInfo(pAVar4,&local_5b0);
      pCVar8 = (ConcatNode *)new<Memory::ArenaAllocator>(0x48,(ArenaAllocator *)pAVar4,0x3f67b0);
      ConcatNode::ConcatNode(pCVar8,&local_470->super_Node,(ConcatNode *)0x0);
      ConcatNode::ConcatNode(pCVar7,&pMVar6->super_Node,pCVar8);
      AltNode::AltNode(pAVar9,(Node *)pCVar7,pAStack_38);
      pAStack_38 = pAVar9;
    }
    else {
      if (pCStack_180 == (ConcatNode *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar3 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                           ,0x1e3,"(suffixNode != nullptr)","suffixNode != nullptr");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar3 = 0;
      }
      if (lastAltNode_local._4_4_ == tailToAdd._4_4_ - 0x400) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar3 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                           ,0x1e4,"(minorCodePoint != minorBoundary - 0x400u)",
                           "minorCodePoint != minorBoundary - 0x400u");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar3 = 0;
      }
      if ((uint)tailToAdd + 0x3ff == (codepoint_t)lastAltNode_local) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar3 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                           ,0x1e5,"(majorBoundary + 0x3FFu != majorCodePoint)",
                           "majorBoundary + 0x3FFu != majorCodePoint");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar3 = 0;
      }
      if (0x7ff < (codepoint_t)lastAltNode_local - lastAltNode_local._4_4_) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar3 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                           ,0x1e9,"(majorCodePoint - minorCodePoint < 0x800u)",
                           "majorCodePoint - minorCodePoint < 0x800u");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar3 = 0;
      }
      pAVar4 = &this->ctAllocator->
                super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
      Memory::TrackAllocData::CreateTrackAllocData
                (&local_398,(type_info *)&AltNode::typeinfo,0,0xffffffffffffffff,
                 "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                 ,0x1ea);
      pAVar4 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
               TrackAllocInfo(pAVar4,&local_398);
      local_3a8 = Memory::ArenaAllocator::Alloc;
      local_3a0 = 0;
      pAVar9 = (AltNode *)new<Memory::ArenaAllocator>(0x60,(ArenaAllocator *)pAVar4,0x3f67b0);
      head = suffixNode;
      pAVar4 = &this->ctAllocator->
                super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
      Memory::TrackAllocData::CreateTrackAllocData
                (&local_3d0,(type_info *)&AltNode::typeinfo,0,0xffffffffffffffff,
                 "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                 ,0x1ea);
      pAVar4 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
               TrackAllocInfo(pAVar4,&local_3d0);
      lowerOfFullRange = (Node *)Memory::ArenaAllocator::Alloc;
      local_3d8 = 0;
      this_01 = (AltNode *)new<Memory::ArenaAllocator>(0x60,(ArenaAllocator *)pAVar4,0x3f67b0);
      AltNode::AltNode(this_01,&pCStack_180->super_Node,(AltNode *)0x0);
      AltNode::AltNode(pAVar9,head,this_01);
      pAStack_38 = pAVar9;
    }
  }
  if (_upperMajorCodeUnit != (AltNode *)0x0) {
    if (_upperMajorCodeUnit->tail != (AltNode *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                         ,0x219,"(lastAltNode->tail == nullptr)","lastAltNode->tail == nullptr");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 0;
    }
    _upperMajorCodeUnit->tail = pAStack_38;
  }
  return pAStack_38;
}

Assistant:

AltNode* Parser<P, IsLiteral>::AppendSurrogateRangeToDisjunction(codepoint_t minorCodePoint, codepoint_t majorCodePoint, AltNode *lastAltNode)
    {
        Assert(minorCodePoint < majorCodePoint);
        Assert(minorCodePoint >= 0x10000u);
        Assert(majorCodePoint >= 0x10000u);
        Assert(scriptContext->GetConfig()->IsES6UnicodeExtensionsEnabled() && unicodeFlagPresent);

        char16 lowerMinorCodeUnit, upperMinorCodeUnit, lowerMajorCodeUnit, upperMajorCodeUnit;
        Js::NumberUtilities::CodePointAsSurrogatePair(minorCodePoint, &lowerMinorCodeUnit, &upperMinorCodeUnit);
        Js::NumberUtilities::CodePointAsSurrogatePair(majorCodePoint, &lowerMajorCodeUnit, &upperMajorCodeUnit);

        // These boundaries represent whole range boundaries, as in 0x10000, 0x10400, 0x10800 etc
        // minor boundary is the first boundary strictly above minorCodePoint
        // major boundary is the first boundary below or equal to majorCodePoint
        codepoint_t minorBoundary = minorCodePoint - (minorCodePoint % 0x400u) + 0x400u;
        codepoint_t majorBoundary = majorCodePoint - (majorCodePoint % 0x400u);

        Assert(minorBoundary >= 0x10000);
        Assert(majorBoundary >= 0x10000);

        AltNode* tailToAdd = nullptr;

        // If the minor boundary is higher than major boundary, that means we have a range within the boundary and is less than 0x400
        // Ex: 0x10430 - 0x10700 will have minor boundary of 0x10800 and major of 0x10400
        // This pair will be represented in single range set.
        const bool singleRange = minorBoundary > majorBoundary;
        if (singleRange)
        {
            Assert(majorCodePoint - minorCodePoint < 0x400u);
            Assert(lowerMinorCodeUnit == lowerMajorCodeUnit);

            MatchCharNode* lowerCharNode = Anew(ctAllocator, MatchCharNode, lowerMinorCodeUnit);
            MatchSetNode* setNode = Anew(ctAllocator, MatchSetNode, false, false);
            setNode->set.SetRange(ctAllocator, (Char)upperMinorCodeUnit, (Char)upperMajorCodeUnit);
            ConcatNode* concatNode = Anew(ctAllocator, ConcatNode, lowerCharNode, Anew(ctAllocator, ConcatNode, setNode, nullptr));

            tailToAdd = Anew(ctAllocator, AltNode, concatNode, nullptr);
        }
        else
        {
            Node* prefixNode = nullptr, *suffixNode = nullptr;
            const bool twoConsecutiveRanges = minorBoundary == majorBoundary;

            // For minorBoundary,
            if (minorBoundary - minorCodePoint == 1) // Single character in minor range
            {
                // The prefix is only a surrogate pair atom
                prefixNode = CreateSurrogatePairAtom(lowerMinorCodeUnit, upperMinorCodeUnit);
            }
            else if (minorCodePoint != minorBoundary - 0x400u) // Minor range isn't full
            {
                Assert(minorBoundary - minorCodePoint < 0x400u);
                MatchCharNode* lowerCharNode = Anew(ctAllocator, MatchCharNode, (Char)lowerMinorCodeUnit);
                MatchSetNode* upperSetNode = Anew(ctAllocator, MatchSetNode, false);
                upperSetNode->set.SetRange(ctAllocator, (Char)upperMinorCodeUnit, (Char)0xDFFFu);
                prefixNode = Anew(ctAllocator, ConcatNode, lowerCharNode, Anew(ctAllocator, ConcatNode, upperSetNode, nullptr));
            }
            else // Full minor range
            {
                minorBoundary -= 0x400u;
            }

            if (majorBoundary == majorCodePoint) // Single character in major range
            {
                // The suffix is only a surrogate pair atom
                suffixNode = CreateSurrogatePairAtom(lowerMajorCodeUnit, upperMajorCodeUnit);
                majorBoundary -= 0x400u;
            }
            else if (majorBoundary + 0x3FFu != majorCodePoint) // Major range isn't full
            {
                Assert(majorCodePoint - majorBoundary < 0x3FFu);
                MatchCharNode* lowerCharNode = Anew(ctAllocator, MatchCharNode, (Char)lowerMajorCodeUnit);
                MatchSetNode* upperSetNode = Anew(ctAllocator, MatchSetNode, false, false);
                upperSetNode->set.SetRange(ctAllocator, (Char)0xDC00u, (Char)upperMajorCodeUnit);
                suffixNode = Anew(ctAllocator, ConcatNode, lowerCharNode, Anew(ctAllocator, ConcatNode, upperSetNode, nullptr));
                majorBoundary -= 0x400u;
            }

            const bool nonFullConsecutiveRanges = twoConsecutiveRanges && prefixNode != nullptr && suffixNode != nullptr;
            if (nonFullConsecutiveRanges)
            {
                Assert(suffixNode != nullptr);
                Assert(minorCodePoint != minorBoundary - 0x400u);
                Assert(majorBoundary + 0x3FFu != majorCodePoint);

                // If the minor boundary is equal to major boundary, that means we have a cross boundary range that only needs 2 nodes for prefix/suffix.
                // We can only cross one boundary.
                Assert(majorCodePoint - minorCodePoint < 0x800u);
                tailToAdd = Anew(ctAllocator, AltNode, prefixNode, Anew(ctAllocator, AltNode, suffixNode, nullptr));
            }
            else
            {
                // We have 3 sets of ranges, comprising of prefix, full and suffix.
                Assert(majorCodePoint - minorCodePoint >= 0x400u);
                Assert((prefixNode != nullptr && suffixNode != nullptr) // Spanning more than two ranges
                    || (prefixNode == nullptr && minorBoundary == minorCodePoint) // Two consecutive ranges and the minor is full
                    || (suffixNode == nullptr && majorBoundary + 0x3FFu == majorCodePoint)); // Two consecutive ranges and the major is full

                Node* lowerOfFullRange;
                char16 lowerMinorBoundary, lowerMajorBoundary, ignore;
                Js::NumberUtilities::CodePointAsSurrogatePair(minorBoundary, &lowerMinorBoundary, &ignore);

                bool singleFullRange = majorBoundary == minorBoundary;
                if (singleFullRange)
                {
                    // The lower part of the full range is simple a surrogate lower char
                    lowerOfFullRange = Anew(ctAllocator, MatchCharNode, (Char)lowerMinorBoundary);
                }
                else
                {

                    Js::NumberUtilities::CodePointAsSurrogatePair(majorBoundary, &lowerMajorBoundary, &ignore);
                    MatchSetNode* setNode = Anew(ctAllocator, MatchSetNode, false, false);
                    setNode->set.SetRange(ctAllocator, (Char)lowerMinorBoundary, (Char)lowerMajorBoundary);
                    lowerOfFullRange = setNode;
                }
                MatchSetNode* fullUpperRange = Anew(ctAllocator, MatchSetNode, false, false);
                fullUpperRange->set.SetRange(ctAllocator, (Char)0xDC00u, (Char)0xDFFFu);

                // These are added in the following order [full] [prefix][suffix]
                // This is doing by prepending, so in reverse.
                if (suffixNode != nullptr)
                {
                    tailToAdd = Anew(ctAllocator, AltNode, suffixNode, tailToAdd);
                }
                if (prefixNode != nullptr)
                {
                    tailToAdd = Anew(ctAllocator, AltNode, prefixNode, tailToAdd);
                }
                tailToAdd = Anew(ctAllocator, AltNode, Anew(ctAllocator, ConcatNode, lowerOfFullRange, Anew(ctAllocator, ConcatNode, fullUpperRange, nullptr)), tailToAdd);
            }
        }

        if (lastAltNode != nullptr)
        {
            Assert(lastAltNode->tail == nullptr);
            lastAltNode->tail = tailToAdd;
        }

        return tailToAdd;
    }